

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

int Aig_ManPartitionSmartFindPart
              (Vec_Ptr_t *vPartSuppsAll,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsBit,
              int nSuppSizeLimit,Vec_Int_t *vOne)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  void *pvVar4;
  uint *pBuffer;
  uint uVar5;
  int i;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int local_40;
  
  local_40 = -1;
  uVar8 = 0;
  i = 0;
  do {
    iVar7 = (int)uVar8;
    if (vPartSuppsAll->nSize <= i) {
      if (iVar7 < 0x4b) {
        local_40 = -1;
      }
      return local_40;
    }
    pvVar4 = Vec_PtrEntry(vPartSuppsAll,i);
    pBuffer = (uint *)Vec_PtrEntry(vPartSuppsBit,i);
    iVar3 = Aig_ManSuppCharCommon(pBuffer,vOne);
    if (iVar3 != 0) {
      if (iVar3 == vOne->nSize) {
        return i;
      }
      iVar1 = *(int *)((long)pvVar4 + 4);
      if ((nSuppSizeLimit < 1) || (iVar1 < nSuppSizeLimit * 2)) {
        uVar2 = (long)(iVar3 * 1000) / (long)vOne->nSize;
        iVar3 = 1;
        if (99 < iVar1) {
          uVar6 = iVar1 - 100;
          if (1 < uVar6) {
            uVar6 = 0;
            for (uVar5 = iVar1 - 0x65; uVar5 != 0; uVar5 = uVar5 >> 1) {
              uVar6 = uVar6 + 1;
            }
          }
          iVar3 = uVar6 + 1;
        }
        uVar2 = (long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) / (long)iVar3
        ;
        iVar3 = (int)uVar2;
        if (iVar7 <= iVar3) {
          uVar8 = uVar2 & 0xffffffff;
        }
        if (iVar7 < iVar3) {
          local_40 = i;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

int Aig_ManPartitionSmartFindPart( Vec_Ptr_t * vPartSuppsAll, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsBit, int nSuppSizeLimit, Vec_Int_t * vOne )
{
    Vec_Int_t * vPartSupp;//, * vPart;
    int Attract, Repulse, Value, ValueBest;
    int i, nCommon, iBest;
    iBest = -1;
    ValueBest = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vPartSupp, i )
    {
//        vPart = Vec_PtrEntry( vPartsAll, i );
//        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPart) >= nSuppSizeLimit )
//            continue;
//        nCommon = Vec_IntTwoCountCommon( vPartSupp, vOne );
        nCommon = Aig_ManSuppCharCommon( (unsigned *)Vec_PtrEntry(vPartSuppsBit, i), vOne );
        if ( nCommon == 0 )
            continue;
        if ( nCommon == Vec_IntSize(vOne) )
            return i;
        // skip partitions whose size exceeds the limit
        if ( nSuppSizeLimit > 0 && Vec_IntSize(vPartSupp) >= 2 * nSuppSizeLimit )
            continue;
        Attract = 1000 * nCommon / Vec_IntSize(vOne);
        if ( Vec_IntSize(vPartSupp) < 100 )
            Repulse = 1;
        else
            Repulse = 1+Abc_Base2Log(Vec_IntSize(vPartSupp)-100);
        Value = Attract/Repulse;
        if ( ValueBest < Value )
        {
            ValueBest = Value;
            iBest = i;
        }
    }
    if ( ValueBest < 75 )
        return -1;
    return iBest;
}